

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aosoa_demo.cpp
# Opt level: O0

float findMaxBalance(Customers *customers)

{
  type *ptVar1;
  float *pfVar2;
  AOSOA<(aosoa::MemoryLayout)1,_aosoa::NamedTuple<int,_CustomerId,_float,_Balance>_> *in_RDI;
  float balance;
  size_t i;
  float maxBalance;
  size_t size;
  size_t in_stack_ffffffffffffffc8;
  type local_24;
  ulong local_20;
  float local_14;
  ulong local_10;
  
  local_10 = aosoa::
             AOSOA<(aosoa::MemoryLayout)1,_aosoa::NamedTuple<int,_CustomerId,_float,_Balance>_>::
             size((AOSOA<(aosoa::MemoryLayout)1,_aosoa::NamedTuple<int,_CustomerId,_float,_Balance>_>
                   *)0x105253);
  local_14 = 0.0;
  for (local_20 = 0; local_20 < local_10; local_20 = local_20 + 1) {
    ptVar1 = aosoa::
             AOSOA<(aosoa::MemoryLayout)1,_aosoa::NamedTuple<int,_CustomerId,_float,_Balance>_>::
             get<Balance>(in_RDI,in_stack_ffffffffffffffc8);
    local_24 = *ptVar1;
    pfVar2 = std::max<float>(&local_14,&local_24);
    local_14 = *pfVar2;
  }
  return local_14;
}

Assistant:

float findMaxBalance(Customers customers) {
  std::size_t size = customers.size();
  // The `size()` method returns either the size of the underlying arrays (SOA)
  // or the origial array (AOS).

  float maxBalance = 0;
  for (size_t i = 0; i < size; ++i) {
    float balance = customers.get<Balance>(i);
    // Attribute access is independent of data layout - this will not have
    // to be refactored if the `Customers` data layout is changed

    maxBalance = std::max(maxBalance, balance);
  }

  return maxBalance;
}